

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_new_multiplicity::test_method(addrman_new_multiplicity *this)

{
  long lVar1;
  pointer pcVar2;
  undefined1 **ppuVar3;
  __single_object _Var4;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint i;
  int iVar8;
  char *pcVar9;
  undefined8 uVar10;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  long lVar13;
  long in_FS_OFFSET;
  initializer_list<CAddress> __l;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  undefined4 local_214;
  size_t local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  AddressPosition addr_pos_multi;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  AddressPosition addr_pos;
  __single_object addrman;
  size_t *local_160;
  undefined1 local_158 [8];
  _Storage<AddressPosition,_true> local_150;
  undefined1 *local_140;
  AddressPosition *pAStack_138;
  uint16_t local_130;
  duration local_128;
  ServiceFlags SStack_120;
  string local_118;
  string local_f8;
  CNetAddr source;
  direct_or_indirect local_b8;
  uint local_a8;
  Network local_a0;
  uint32_t uStack_9c;
  uint16_t local_98;
  CAddress addr;
  string addr_ip;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_150._0_8_ = &local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"253.3.3.3","");
  ResolveService((CService *)&local_b8.indirect_contents,(string *)&local_150._M_value,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents);
  addr.super_CService.super_CNetAddr.m_net = local_a0;
  addr.super_CService.super_CNetAddr.m_scope_id = uStack_9c;
  addr.super_CService.port = local_98;
  addr.nTime.__d.__r = (duration)100000000;
  addr.nServices = NODE_NONE;
  if (0x10 < local_a8) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((undefined1 **)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_,(ulong)(local_140 + 1));
  }
  tVar5 = NodeClock::now();
  iVar8 = 1;
  addr.nTime.__d.__r = (duration)(duration)((long)tVar5.__d.__r / 1000000000);
  do {
    addr_pos._0_4_ = iVar8;
    util::ToString<unsigned_int>(&local_f8,(uint *)&addr_pos);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_f8,".");
    source.m_addr._union.indirect_contents.indirect = (char *)&source.m_addr._size;
    pcVar2 = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar7) {
      source.m_addr._16_8_ = paVar7->_M_allocated_capacity;
      source._24_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      source.m_addr._16_8_ = paVar7->_M_allocated_capacity;
      source.m_addr._union.indirect_contents.indirect = pcVar2;
    }
    source.m_addr._union._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    addr_pos_multi._0_8_ = addr_pos_multi._0_8_ & 0xffffffff00000000;
    util::ToString<unsigned_int>(&local_118,(uint *)&addr_pos_multi);
    pcVar9 = (char *)0xf;
    if ((size_type *)source.m_addr._union.indirect_contents.indirect != &source.m_addr._size) {
      pcVar9 = (char *)source.m_addr._16_8_;
    }
    pvVar11 = (iterator)source.m_addr._union._8_8_;
    if (pcVar9 < (char *)(local_118._M_string_length + source.m_addr._union._8_8_)) {
      uVar10 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar10 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < (char *)(local_118._M_string_length + source.m_addr._union._8_8_))
      goto LAB_0022d8be;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_118,0,0,source.m_addr._union.indirect_contents.indirect,
                       source.m_addr._union._8_8_);
    }
    else {
LAB_0022d8be:
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &source,local_118._M_dataplus._M_p,local_118._M_string_length);
    }
    local_150._0_8_ = &local_140;
    ppuVar3 = (undefined1 **)(pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppuVar3 == paVar7) {
      local_140 = (undefined1 *)paVar7->_M_allocated_capacity;
      pAStack_138 = *(AddressPosition **)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_140 = (undefined1 *)paVar7->_M_allocated_capacity;
      local_150._0_8_ = ppuVar3;
    }
    local_150._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    paVar7->_M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_150._M_value,".1.1");
    addr_ip._M_dataplus._M_p = (pointer)&addr_ip.field_2;
    pcVar2 = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar7) {
      addr_ip.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      addr_ip.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      addr_ip.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      addr_ip._M_dataplus._M_p = pcVar2;
    }
    addr_ip._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    if ((undefined1 **)local_150._0_8_ != &local_140) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_140 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      (ulong)(local_118.field_2._M_allocated_capacity + 1));
    }
    if ((size_type *)source.m_addr._union.indirect_contents.indirect != &source.m_addr._size) {
      operator_delete(source.m_addr._union.indirect_contents.indirect,source.m_addr._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._M_dataplus._M_p._1_7_,local_f8._M_dataplus._M_p._0_1_) !=
        &local_f8.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._M_dataplus._M_p._1_7_,local_f8._M_dataplus._M_p._0_1_),
                      local_f8.field_2._M_allocated_capacity + 1);
    }
    ResolveIP(&source,&addr_ip);
    _Var4 = addrman;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150._M_value,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
    pAStack_138 = (AddressPosition *)addr.super_CService.super_CNetAddr._24_8_;
    local_130 = addr.super_CService.port;
    local_128 = addr.nTime.__d.__r;
    SStack_120 = addr.nServices;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_150;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,__l,
               (allocator_type *)&local_118);
    AddrMan::Add((AddrMan *)
                 _Var4._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                 (vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,&source,(seconds)0x0);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8);
    if (0x10 < (uint)local_140) {
      free((void *)local_150._0_8_);
      local_150._0_8_ = (undefined1 **)0x0;
    }
    if (0x10 < source.m_addr._size) {
      free(source.m_addr._union.indirect_contents.indirect);
      source.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)addr_ip._M_dataplus._M_p != &addr_ip.field_2) {
      operator_delete(addr_ip._M_dataplus._M_p,addr_ip.field_2._M_allocated_capacity + 1);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x14);
  AddrMan::FindAddressEntry
            ((optional<AddressPosition> *)&local_150._M_value,
             (AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr);
  if ((char)local_140 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    addr_pos.tried = local_150._M_value.tried;
    addr_pos._1_3_ = local_150._1_3_;
    addr_pos.multiplicity = local_150._M_value.multiplicity;
    addr_pos.bucket = local_150._M_value.bucket;
    addr_pos.position = local_150._M_value.position;
    local_188 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_180 = "";
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x14a;
    file.m_begin = (iterator)&local_188;
    msg.m_end = in_R9;
    msg.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
    source.m_addr._union._8_8_ = source.m_addr._union._8_8_ & 0xffffffffffffff00;
    source.m_addr._union.indirect_contents.indirect = "@;\x1f";
    source.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    source._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    addr_pos_multi._0_8_ = &addr_pos.multiplicity;
    local_f8._M_dataplus._M_p._0_1_ = addr_pos.multiplicity == 1;
    local_160 = (size_t *)CONCAT44(local_160._4_4_,1);
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_118._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_118._M_string_length = 0xe52ae3;
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150._0_8_ = &PTR__lazy_ostream_013abcf0;
    local_140 = boost::unit_test::lazy_ostream::inst;
    pAStack_138 = &addr_pos_multi;
    addr_ip._M_string_length = addr_ip._M_string_length & 0xffffffffffffff00;
    addr_ip._M_dataplus._M_p = "@;\x1f";
    addr_ip.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x2;
    local_158 = (undefined1  [8])&local_160;
    addr_ip.field_2._8_8_ = local_158;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_f8,(lazy_ostream *)&source,1,2,REQUIRE,0xe53594,
               (size_t)&local_118,0x14a,&local_150,"1U",&addr_ip);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_f8.field_2._M_allocated_capacity);
    local_1a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1a0 = "";
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x14b;
    file_00.m_begin = (iterator)&local_1a8;
    msg_00.m_end = pvVar12;
    msg_00.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b8,
               msg_00);
    source.m_addr._union._8_8_ = source.m_addr._union._8_8_ & 0xffffffffffffff00;
    source.m_addr._union.indirect_contents.indirect = "@;\x1f";
    source.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    source._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_160 = (size_t *)
                AddrMan::Size((AddrMan *)
                              addrman._M_t.
                              super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                              super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                              super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                              (optional<Network>)0x0,(optional<bool>)0x0);
    local_158 = (undefined1  [8])&local_210;
    local_210 = CONCAT44(local_210._4_4_,1);
    local_f8._M_dataplus._M_p._0_1_ = local_160 == (size_t *)0x1;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_118._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_118._M_string_length = 0xe52ae3;
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_150._0_8_ = &PTR__lazy_ostream_013abb70;
    local_140 = boost::unit_test::lazy_ostream::inst;
    pAStack_138 = &addr_pos_multi;
    addr_ip._M_string_length = addr_ip._M_string_length & 0xffffffffffffff00;
    addr_ip._M_dataplus._M_p = "@;\x1f";
    addr_ip.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pvVar11 = (iterator)0x2;
    addr_pos_multi._0_8_ = &local_160;
    addr_ip.field_2._8_8_ = local_158;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_f8,(lazy_ostream *)&source,1,2,REQUIRE,0xe52afd,
               (size_t)&local_118,0x14b,&local_150,"1U",&addr_ip);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_f8.field_2._M_allocated_capacity);
    lVar13 = 1;
    do {
      addr_pos_multi._0_8_ = CONCAT44(addr_pos_multi.multiplicity,(int)lVar13) & 0xffffffff000000ff;
      util::ToString<unsigned_int>(&local_f8,(uint *)&addr_pos_multi);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_f8,".");
      source.m_addr._union.indirect_contents.indirect = (char *)&source.m_addr._size;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar7) {
        source.m_addr._16_8_ = paVar7->_M_allocated_capacity;
        source._24_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        source.m_addr._16_8_ = paVar7->_M_allocated_capacity;
        source.m_addr._union.indirect_contents.indirect = pcVar2;
      }
      source.m_addr._union._8_8_ = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      local_158 = (undefined1  [8])
                  (CONCAT44(local_158._4_4_,(int)((ulong)lVar13 >> 8)) & 0xffffffff00ffffff);
      util::ToString<unsigned_int>(&local_118,(uint *)local_158);
      pcVar9 = (char *)0xf;
      if ((size_type *)source.m_addr._union.indirect_contents.indirect != &source.m_addr._size) {
        pcVar9 = (char *)source.m_addr._16_8_;
      }
      pvVar12 = (iterator)source.m_addr._union._8_8_;
      if (pcVar9 < (char *)(local_118._M_string_length + source.m_addr._union._8_8_)) {
        uVar10 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          uVar10 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < (char *)(local_118._M_string_length + source.m_addr._union._8_8_))
        goto LAB_0022df48;
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_118,0,0,source.m_addr._union.indirect_contents.indirect,
                         source.m_addr._union._8_8_);
      }
      else {
LAB_0022df48:
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &source,local_118._M_dataplus._M_p,local_118._M_string_length);
      }
      local_150._0_8_ = &local_140;
      ppuVar3 = (undefined1 **)(pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppuVar3 == paVar7) {
        local_140 = (undefined1 *)paVar7->_M_allocated_capacity;
        pAStack_138 = *(AddressPosition **)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_140 = (undefined1 *)paVar7->_M_allocated_capacity;
        local_150._0_8_ = ppuVar3;
      }
      local_150._8_8_ = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      paVar7->_M_local_buf[0] = '\0';
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_150._M_value,".1.1");
      addr_ip._M_dataplus._M_p = (pointer)&addr_ip.field_2;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar7) {
        addr_ip.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        addr_ip.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        addr_ip.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        addr_ip._M_dataplus._M_p = pcVar2;
      }
      addr_ip._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      if ((undefined1 **)local_150._0_8_ != &local_140) {
        operator_delete((void *)local_150._0_8_,(ulong)(local_140 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        (ulong)(local_118.field_2._M_allocated_capacity + 1));
      }
      if ((size_type *)source.m_addr._union.indirect_contents.indirect != &source.m_addr._size) {
        operator_delete(source.m_addr._union.indirect_contents.indirect,source.m_addr._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_f8._M_dataplus._M_p._1_7_,local_f8._M_dataplus._M_p._0_1_) !=
          &local_f8.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_f8._M_dataplus._M_p._1_7_,local_f8._M_dataplus._M_p._0_1_)
                        ,local_f8.field_2._M_allocated_capacity + 1);
      }
      ResolveIP(&source,&addr_ip);
      _Var4 = addrman;
      addr.nTime.__d.__r = (duration)((long)tVar5.__d.__r / 1000000000 + lVar13);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150._M_value,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
      pAStack_138 = (AddressPosition *)addr.super_CService.super_CNetAddr._24_8_;
      local_130 = addr.super_CService.port;
      local_128 = addr.nTime.__d.__r;
      SStack_120 = addr.nServices;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_150;
      std::vector<CAddress,_std::allocator<CAddress>_>::vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,__l_00,
                 (allocator_type *)&local_118);
      AddrMan::Add((AddrMan *)
                   _Var4._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                   (vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,&source,(seconds)0x0);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8);
      if (0x10 < (uint)local_140) {
        free((void *)local_150._0_8_);
        local_150._0_8_ = (undefined1 **)0x0;
      }
      if (0x10 < source.m_addr._size) {
        free(source.m_addr._union.indirect_contents.indirect);
        source.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)addr_ip._M_dataplus._M_p != &addr_ip.field_2) {
        operator_delete(addr_ip._M_dataplus._M_p,addr_ip.field_2._M_allocated_capacity + 1);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 400);
    AddrMan::FindAddressEntry
              ((optional<AddressPosition> *)&local_150._M_value,
               (AddrMan *)
               addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr);
    if ((char)local_140 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      addr_pos_multi.tried = local_150._M_value.tried;
      addr_pos_multi._1_3_ = local_150._1_3_;
      addr_pos_multi.multiplicity = local_150._M_value.multiplicity;
      addr_pos_multi.bucket = local_150._M_value.bucket;
      addr_pos_multi.position = local_150._M_value.position;
      local_1d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_1d0 = "";
      local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x157;
      file_01.m_begin = (iterator)&local_1d8;
      msg_01.m_end = pvVar11;
      msg_01.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e8,
                 msg_01);
      source.m_addr._union._8_8_ = source.m_addr._union._8_8_ & 0xffffffffffffff00;
      source.m_addr._union.indirect_contents.indirect = "@;\x1f";
      source.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
      source._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_158 = (undefined1  [8])&addr_pos_multi.multiplicity;
      local_f8._M_dataplus._M_p._0_1_ = addr_pos_multi.multiplicity == 8;
      local_210 = CONCAT44(local_210._4_4_,8);
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_118._M_string_length = 0xe52ae3;
      local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
      local_150._0_8_ = &PTR__lazy_ostream_013abcf0;
      local_140 = boost::unit_test::lazy_ostream::inst;
      pAStack_138 = (AddressPosition *)local_158;
      local_160 = &local_210;
      addr_ip._M_string_length = addr_ip._M_string_length & 0xffffffffffffff00;
      addr_ip._M_dataplus._M_p = "@;\x1f";
      addr_ip.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0x2;
      addr_ip.field_2._8_8_ = &local_160;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_f8,(lazy_ostream *)&source,1,2,REQUIRE,0xe535aa,
                 (size_t)&local_118,0x157,&local_150,"8U",&addr_ip);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_f8.field_2._M_allocated_capacity);
      local_1f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_1f0 = "";
      local_208 = &boost::unit_test::basic_cstring<char_const>::null;
      local_200 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x159;
      file_02.m_begin = (iterator)&local_1f8;
      msg_02.m_end = pvVar12;
      msg_02.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_208,
                 msg_02);
      source.m_addr._union._8_8_ = source.m_addr._union._8_8_ & 0xffffffffffffff00;
      source.m_addr._union.indirect_contents.indirect = "@;\x1f";
      source.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
      source._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_210 = AddrMan::Size((AddrMan *)
                                addrman._M_t.
                                super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                (optional<Network>)0x0,(optional<bool>)0x0);
      local_160 = (size_t *)&local_214;
      local_214 = 1;
      local_f8._M_dataplus._M_p._0_1_ = local_210 == 1;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_118._M_string_length = 0xe52ae3;
      local_158 = (undefined1  [8])&local_210;
      local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
      local_150._0_8_ = &PTR__lazy_ostream_013abb70;
      local_140 = boost::unit_test::lazy_ostream::inst;
      pAStack_138 = (AddressPosition *)local_158;
      addr_ip._M_string_length = addr_ip._M_string_length & 0xffffffffffffff00;
      addr_ip._M_dataplus._M_p = "@;\x1f";
      addr_ip.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      addr_ip.field_2._8_8_ = &local_160;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_f8,(lazy_ostream *)&source,1,2,REQUIRE,0xe52afd,
                 (size_t)&local_118,0x159,&local_150,"1U",&addr_ip);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_f8.field_2._M_allocated_capacity);
      if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
        free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_new_multiplicity)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    CAddress addr{CAddress(ResolveService("253.3.3.3", 8333), NODE_NONE)};
    const auto start_time{Now<NodeSeconds>()};
    addr.nTime = start_time;

    // test that multiplicity stays at 1 if nTime doesn't increase
    for (unsigned int i = 1; i < 20; ++i) {
        std::string addr_ip{ToString(i % 256) + "." + ToString(i >> 8 % 256) + ".1.1"};
        CNetAddr source{ResolveIP(addr_ip)};
        addrman->Add({addr}, source);
    }
    AddressPosition addr_pos = addrman->FindAddressEntry(addr).value();
    BOOST_CHECK_EQUAL(addr_pos.multiplicity, 1U);
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // if nTime increases, an addr can occur in up to 8 buckets
    // The acceptance probability decreases exponentially with existing multiplicity -
    // choose number of iterations such that it gets to 8 with deterministic addrman.
    for (unsigned int i = 1; i < 400; ++i) {
        std::string addr_ip{ToString(i % 256) + "." + ToString(i >> 8 % 256) + ".1.1"};
        CNetAddr source{ResolveIP(addr_ip)};
        addr.nTime = start_time + std::chrono::seconds{i};
        addrman->Add({addr}, source);
    }
    AddressPosition addr_pos_multi = addrman->FindAddressEntry(addr).value();
    BOOST_CHECK_EQUAL(addr_pos_multi.multiplicity, 8U);
    // multiplicity doesn't affect size
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
}